

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_test.cpp
# Opt level: O2

void __thiscall StringPrintf_FancyPctD_Test::TestBody(StringPrintf_FancyPctD_Test *this)

{
  char *pcVar1;
  char *pcVar2;
  uint64_t ubig;
  AssertionResult gtest_ar;
  string local_38;
  int64_t ibig;
  AssertHelper local_10;
  
  ubig = CONCAT44(ubig._4_4_,1);
  pbrt::StringPrintf<unsigned_int>(&local_38,"%d",(uint *)&ubig);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"1\"","StringPrintf(\"%d\", 1u)",(char (*) [2])0x523be8,
             &local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ubig,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/print_test.cpp"
               ,0x44,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&ubig,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ubig);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_38);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  ubig = CONCAT44(ubig._4_4_,0xffffffff);
  pbrt::StringPrintf<unsigned_int>(&local_38,"%d",(uint *)&ubig);
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"4294967295\"","StringPrintf(\"%d\", 0xffffffffu)",
             (char (*) [11])"4294967295",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ubig,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/print_test.cpp"
               ,0x45,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&ubig,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ubig);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_38);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  ubig = 100000000000;
  pbrt::StringPrintf<unsigned_long>(&local_38,"%d",&ubig);
  pcVar1 = "100000000000";
  testing::internal::CmpHelperEQ<char[13],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"100000000000\"","StringPrintf(\"%d\", size_t(100000000000))",
             (char (*) [13])"100000000000",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x48;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ubig,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/print_test.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&ubig,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ubig);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_38);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  ubig = 0xffffffffffffffff;
  pbrt::StringPrintf<unsigned_long&>
            (&local_38,(pbrt *)0x6c0db4,(char *)&ubig,(unsigned_long *)pcVar1);
  pcVar1 = "18446744073709551615";
  testing::internal::CmpHelperEQ<char[21],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"18446744073709551615\"","StringPrintf(\"%d\", ubig)",
             (char (*) [21])"18446744073709551615",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x4b;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ibig,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/print_test.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&ibig,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ibig);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_38);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  ibig = ubig >> 1;
  pbrt::StringPrintf<long&>(&local_38,(pbrt *)0x6c0db4,(char *)&ibig,(long *)pcVar1);
  testing::internal::CmpHelperEQ<char[20],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"9223372036854775807\"","StringPrintf(\"%d\", ibig)",
             (char (*) [20])"9223372036854775807",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/print_test.cpp"
               ,0x4e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_10,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_10);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_38);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(StringPrintf, FancyPctD) {
    EXPECT_EQ("1", StringPrintf("%d", 1u));
    EXPECT_EQ("4294967295", StringPrintf("%d", 0xffffffffu));

    // > 4G
    EXPECT_EQ("100000000000", StringPrintf("%d", size_t(100000000000)));

    uint64_t ubig = ~0ull;
    EXPECT_EQ("18446744073709551615", StringPrintf("%d", ubig));

    int64_t ibig = ubig >> 1;
    EXPECT_EQ("9223372036854775807", StringPrintf("%d", ibig));
}